

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_test.cpp
# Opt level: O0

void evaluations_test<viennamath::ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>>
               (ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
                *e,double ref_solution)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  ct_constant<8L> *in_R8;
  numeric_type nVar4;
  type tVar5;
  type tVar6;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  in_stack_fffffffffffffd78;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_148;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_11a;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_118;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_ea;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_e8;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_ba;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_b8;
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  local_90;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_68;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_66;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  local_64;
  allocator<double> local_61;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> p;
  ct_constant<8L> c8;
  undefined1 local_38 [8];
  rt_constant<long,_viennamath::rt_expression_interface<double>_> c6;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c4;
  double ref_solution_local;
  ct_binary_expr<viennamath::ct_constant<8L>,_viennamath::op_plus<double>,_viennamath::ct_variable<0UL>_>
  *e_local;
  
  viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s,4.0);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::rt_constant
            ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_38,6);
  viennamath::ct_constant<8L>::ct_constant
            ((ct_constant<8L> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<double>::allocator(&local_61);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,3,&local_61);
  std::allocator<double>::~allocator(&local_61);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,0);
  *pvVar2 = 4.0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,1);
  *pvVar2 = 6.0;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,2);
  *pvVar2 = 8.0;
  poVar3 = viennamath::operator<<((ostream *)&std::cout,e);
  poVar3 = std::operator<<(poVar3," at STL (");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
  poVar3 = std::operator<<(poVar3,", ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
  poVar3 = std::operator<<(poVar3,", ");
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar2);
  poVar3 = std::operator<<(poVar3,")");
  poVar3 = std::operator<<(poVar3," = ");
  nVar4 = viennamath::
          ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>
          ::operator()((ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>
                        *)e,(vector<double,_std::allocator<double>_> *)local_60);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nVar4);
  poVar3 = std::operator<<(poVar3," = ");
  local_64 = *e;
  tVar5 = viennamath::
          eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,std::vector<double,std::allocator<double>>>
                    (in_stack_fffffffffffffd78,(vector<double,_std::allocator<double>_> *)local_60);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,tVar5);
  poVar3 = std::operator<<(poVar3," (reference solution: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ref_solution);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_66 = *e;
  tVar5 = viennamath::
          eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,std::vector<double,std::allocator<double>>>
                    (in_stack_fffffffffffffd78,(vector<double,_std::allocator<double>_> *)local_60);
  bVar1 = false;
  if (tVar5 <= ref_solution) {
    local_68 = *e;
    tVar5 = viennamath::
            eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,std::vector<double,std::allocator<double>>>
                      (in_stack_fffffffffffffd78,(vector<double,_std::allocator<double>_> *)local_60
                      );
    bVar1 = ref_solution <= tVar5;
  }
  if (!bVar1) {
    __assert_fail("viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_test.cpp"
                  ,0x45,
                  "void evaluations_test(const E &, double) [E = viennamath::ct_binary_expr<viennamath::ct_constant<8>, viennamath::op_plus<double>, viennamath::ct_variable<>>]"
                 );
  }
  poVar3 = viennamath::operator<<((ostream *)&std::cout,e);
  poVar3 = std::operator<<(poVar3," at vector_3 (");
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_90,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  poVar3 = viennamath::operator<<(poVar3,&local_90);
  poVar3 = std::operator<<(poVar3,")");
  poVar3 = std::operator<<(poVar3," = ");
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_b8,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  nVar4 = viennamath::
          ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>
          ::operator()((ct_binary_expr<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>>
                        *)e,&local_b8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,nVar4);
  poVar3 = std::operator<<(poVar3," = ");
  local_ba = *e;
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_e8,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  tVar5 = viennamath::
          eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,viennamath::ct_vector_3<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>>
                    (in_stack_fffffffffffffd78,&local_e8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,tVar5);
  poVar3 = std::operator<<(poVar3," (reference solution: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ref_solution);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  viennamath::
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  ::~ct_vector_3(&local_e8);
  viennamath::
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  ::~ct_vector_3(&local_b8);
  viennamath::
  ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
  ::~ct_vector_3(&local_90);
  local_ea = *e;
  viennamath::
  make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
            (&local_118,(viennamath *)&c6.s,
             (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
             (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
             ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3),in_R8);
  tVar5 = viennamath::
          eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,viennamath::ct_vector_3<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>>
                    (in_stack_fffffffffffffd78,&local_118);
  bVar1 = false;
  if (tVar5 <= ref_solution) {
    local_11a = *e;
    viennamath::
    make_vector<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
              (&local_148,(viennamath *)&c6.s,
               (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)local_38,
               (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)
               ((long)&p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3),in_R8);
    tVar6 = viennamath::
            eval<viennamath::ct_constant<8l>,viennamath::op_plus<double>,viennamath::ct_variable<0ul>,viennamath::ct_vector_3<viennamath::rt_constant<double,viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>>
                      (in_stack_fffffffffffffd78,&local_148);
    bVar1 = ref_solution <= tVar6;
  }
  if (bVar1) {
    if (tVar5 <= ref_solution) {
      viennamath::
      ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
      ::~ct_vector_3(&local_148);
    }
    viennamath::
    ct_vector_3<viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>_>
    ::~ct_vector_3(&local_118);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_60);
    viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::~rt_constant
              ((rt_constant<long,_viennamath::rt_expression_interface<double>_> *)local_38);
    viennamath::rt_constant<double,_viennamath::rt_expression_interface<double>_>::~rt_constant
              ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)&c6.s);
    return;
  }
  __assert_fail("viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_test.cpp"
                ,0x4b,
                "void evaluations_test(const E &, double) [E = viennamath::ct_binary_expr<viennamath::ct_constant<8>, viennamath::op_plus<double>, viennamath::ct_variable<>>]"
               );
}

Assistant:

void evaluations_test(E const & e, double ref_solution)
{
  viennamath::rt_constant<double> c4(4.0);
  viennamath::rt_constant<long> c6(6);
  viennamath::ct_constant<8> c8;

  std::vector<double> p(3);
  p[0] = 4;
  p[1] = 6;
  p[2] = 8;

  std::cout << e << " at STL (" << p[0] << ", " << p[1] << ", " << p[2] << ")"
            << " = " << e(p)
            << " = " << viennamath::eval(e,p)
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, p) <= ref_solution && viennamath::eval(e, p) >= ref_solution);

  std::cout << e << " at vector_3 (" << viennamath::make_vector(c4, c6, c8) << ")"
            << " = " << e(viennamath::make_vector(c4, c6, c8))
            << " = " << viennamath::eval(e, viennamath::make_vector(c4, c6, c8))
            << " (reference solution: " << ref_solution << ")" << std::endl;
  assert(viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) <= ref_solution && viennamath::eval(e, viennamath::make_vector(c4, c6, c8)) >= ref_solution);
}